

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

socket_t httplib::detail::create_client_socket
                   (char *host,int port,bool tcp_nodelay,SocketOptions *socket_options,
                   time_t timeout_sec,time_t timeout_usec,string *intf,Error *error)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  SocketOptions socket_options_00;
  anon_class_32_4_f0d0a25b bind_or_connect;
  socket_t sVar3;
  Error EVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Manager_type p_Var7;
  time_t timeout_usec_local;
  time_t timeout_sec_local;
  string *local_38;
  Error *pEStack_30;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  uVar5 = (void *)0x0;
  uVar6 = 0;
  p_Var1 = socket_options->_M_invoker;
  p_Var2 = (socket_options->super__Function_base)._M_manager;
  p_Var7 = (_Manager_type)0x0;
  if (p_Var2 != (_Manager_type)0x0) {
    uVar5 = *(undefined8 *)&(socket_options->super__Function_base)._M_functor;
    uVar6 = *(undefined8 *)((long)&(socket_options->super__Function_base)._M_functor + 8);
    (socket_options->super__Function_base)._M_manager = (_Manager_type)0x0;
    socket_options->_M_invoker = (_Invoker_type)0x0;
    p_Var7 = p_Var2;
  }
  local_38 = intf;
  pEStack_30 = error;
  local_28 = (_Manager_type)&timeout_sec_local;
  p_Stack_20 = (_Invoker_type)&timeout_usec_local;
  EVar4 = Success;
  socket_options_00.super__Function_base._M_functor._8_8_ = error;
  socket_options_00.super__Function_base._M_functor._M_unused._M_object = intf;
  socket_options_00.super__Function_base._M_manager = local_28;
  socket_options_00._M_invoker = p_Stack_20;
  bind_or_connect.error = (Error *)uVar6;
  bind_or_connect.intf = (string *)uVar5;
  bind_or_connect.timeout_sec = (time_t *)p_Var7;
  bind_or_connect.timeout_usec = (time_t *)p_Var1;
  timeout_usec_local = timeout_usec;
  timeout_sec_local = timeout_sec;
  sVar3 = create_socket<httplib::detail::create_client_socket(char_const*,int,bool,std::function<void(int)>,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (host,port,0,tcp_nodelay,socket_options_00,bind_or_connect);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff98);
  if (sVar3 == -1) {
    if (*error != Success) {
      return -1;
    }
    EVar4 = Connection;
  }
  *error = EVar4;
  return sVar3;
}

Assistant:

inline socket_t create_client_socket(const char *host, int port,
											 bool tcp_nodelay,
											 SocketOptions socket_options,
											 time_t timeout_sec, time_t timeout_usec,
											 const std::string &intf, Error &error) {
			auto sock = create_socket(
					host, port, 0, tcp_nodelay, std::move(socket_options),
					[&](socket_t sock, struct addrinfo &ai) -> bool {
						if (!intf.empty()) {
#ifdef USE_IF2IP
							auto ip = if2ip(intf);
							if (ip.empty()) { ip = intf; }
							if (!bind_ip_address(sock, ip.c_str())) {
								error = Error::BindIPAddress;
								return false;
							}
#endif
						}

						set_nonblocking(sock, true);

						auto ret =
								::connect(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen));

						if (ret < 0) {
							if (is_connection_error() ||
								!wait_until_socket_is_ready(sock, timeout_sec, timeout_usec)) {
								close_socket(sock);
								error = Error::Connection;
								return false;
							}
						}

						set_nonblocking(sock, false);
						error = Error::Success;
						return true;
					});

			if (sock != INVALID_SOCKET) {
				error = Error::Success;
			} else {
				if (error == Error::Success) { error = Error::Connection; }
			}

			return sock;
		}